

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.h
# Opt level: O1

void __thiscall level_info_t::level_info_t(level_info_t *this)

{
  (this->MapName).Chars = FString::NullString.Nothing;
  (this->NextMap).Chars = FString::NullString.Nothing;
  (this->NextSecretMap).Chars = FString::NullString.Nothing;
  (this->PName).Chars = FString::NullString.Nothing;
  (this->SkyPic1).Chars = FString::NullString.Nothing;
  (this->SkyPic2).Chars = FString::NullString.Nothing;
  (this->FadeTable).Chars = FString::NullString.Nothing;
  (this->F1Pic).Chars = FString::NullString.Nothing;
  (this->BorderTexture).Chars = FString::NullString.Nothing;
  (this->MapBackground).Chars = FString::NullString.Nothing;
  (this->Music).Chars = FString::NullString.Nothing;
  (this->LevelName).Chars = FString::NullString.Nothing;
  (this->Translator).Chars = FString::NullString.Nothing;
  this->Intermission = 0;
  this->deathsequence = 0;
  this->slideshow = 0;
  this->RedirectType = 0;
  (this->RedirectMapName).Chars = FString::NullString.Nothing;
  (this->EnterPic).Chars = FString::NullString.Nothing;
  (this->ExitPic).Chars = FString::NullString.Nothing;
  (this->InterMusic).Chars = FString::NullString.Nothing;
  (this->SoundInfo).Chars = FString::NullString.Nothing;
  (this->SndSeq).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 0x13;
  (this->optdata).NumUsed = 0;
  TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>::
  SetNodeVector(&this->optdata,1);
  (this->MusicMap).NumUsed = 0;
  TMap<int,_FName,_THashTraits<int>,_TValueTraits<FName>_>::SetNodeVector(&this->MusicMap,1);
  (this->PrecacheClasses).Array = (FName *)0x0;
  (this->PrecacheClasses).Most = 0;
  (this->PrecacheClasses).Count = 0;
  (this->PrecacheTextures).Array = (FString *)0x0;
  (this->PrecacheTextures).Most = 0;
  (this->PrecacheTextures).Count = 0;
  (this->PrecacheSounds).Array = (FSoundID *)0x0;
  (this->PrecacheSounds).Most = 0;
  (this->PrecacheSounds).Count = 0;
  (this->specialactions).Array = (FSpecialAction *)0x0;
  (this->specialactions).Most = 0;
  (this->specialactions).Count = 0;
  Reset(this);
  return;
}

Assistant:

level_info_t() 
	{ 
		Reset(); 
	}